

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> * __thiscall
vkb::Swapchain::get_images
          (Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> *__return_storage_ptr__,
          Swapchain *this)

{
  VkResult VVar1;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> local_28;
  
  local_28.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VVar1 = detail::
          get_vector<VkImage_T*,VkResult(*&)(VkDevice_T*,VkSwapchainKHR_T*,unsigned_int*,VkImage_T**),VkDevice_T*&,VkSwapchainKHR_T*&>
                    (&local_28,
                     (_func_VkResult_VkDevice_T_ptr_VkSwapchainKHR_T_ptr_uint_ptr_VkImage_T_ptr_ptr
                      **)&this->internal_table,&this->device,&this->swapchain);
  if (VVar1 == VK_SUCCESS) {
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_28.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.super__Vector_impl_data.
    _M_start = local_28.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_28.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    __return_storage_ptr__->m_init = true;
  }
  else {
    (__return_storage_ptr__->field_0).m_error.type._M_value = 3;
    (__return_storage_ptr__->field_0).m_error.vk_result = VVar1;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)&detail::swapchain_error_category;
    __return_storage_ptr__->m_init = false;
    if (local_28.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_28.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<std::vector<VkImage>> Swapchain::get_images() {
    std::vector<VkImage> swapchain_images;

    auto swapchain_images_ret =
        detail::get_vector<VkImage>(swapchain_images, internal_table.fp_vkGetSwapchainImagesKHR, device, swapchain);
    if (swapchain_images_ret != VK_SUCCESS) {
        return Error{ SwapchainError::failed_get_swapchain_images, swapchain_images_ret };
    }
    return swapchain_images;
}